

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O3

void __thiscall
mserialize::detail::visit_enum<binlog::ToStringVisitor,binlog::Range>
          (detail *this,string_view tag,ToStringVisitor *visitor,Range *istream)

{
  detail *pdVar1;
  detail *pdVar2;
  char *pcVar3;
  detail tag_00;
  Enum e;
  undefined1 *puVar4;
  runtime_error *this_00;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  char *pcVar14;
  detail *pdVar15;
  char *pcVar16;
  IntegerToHex hex;
  IntegerToHex local_d0;
  ulong local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  detail *local_88;
  ulong uStack_80;
  detail *local_78;
  char *pcStack_70;
  detail local_68;
  undefined7 uStack_67;
  char *pcStack_60;
  undefined1 *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b0 = (ulong)(tag._ptr != (char *)0x0);
  pdVar1 = this + local_b0;
  lVar11 = (long)tag._ptr - local_b0;
  uVar8 = 0;
  if (lVar11 != 0) {
    uVar8 = lVar11 - 1U;
  }
  if (lVar11 == 0 || lVar11 - 1U == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,pdVar1,pdVar1 + uVar8);
    std::operator+(&local_50,"Invalid enum tag: \'",&local_a8);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_d0._buffer._0_8_ = *plVar5;
    plVar7 = plVar5 + 2;
    if ((long *)local_d0._buffer._0_8_ == plVar7) {
      local_d0._16_8_ = *plVar7;
      local_d0._p = (char *)plVar5[3];
      local_d0._buffer._0_8_ = local_d0._buffer + 0x10;
    }
    else {
      local_d0._16_8_ = *plVar7;
    }
    local_d0._buffer._8_8_ = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::runtime_error::runtime_error(this_00,(string *)&local_d0);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tag_00 = *pdVar1;
  local_d0._p = local_d0._buffer + 0x13;
  visit_arithmetic<mserialize::detail::IntegerToHex,binlog::Range>
            ((char)tag_00,&local_d0,(Range *)visitor);
  pcVar14 = local_d0._p;
  uVar12 = 2;
  if (uVar8 < 2) {
    uVar12 = uVar8;
  }
  local_88 = pdVar1 + uVar12;
  uVar6 = 0;
  uVar9 = uVar8 - uVar12;
  uStack_80 = uVar6;
  if (uVar9 != 0) {
    do {
      uStack_80 = uVar6;
      if (local_88[uVar6] == (detail)0x27) break;
      uVar6 = uVar6 + 1;
      uStack_80 = uVar9;
    } while (uVar9 != uVar6);
  }
  uVar6 = uStack_80;
  if (uVar9 < uStack_80) {
    uVar6 = uVar9;
  }
  pdVar2 = local_88 + uVar6;
  pcVar10 = (char *)(uVar9 - uVar6);
  puVar4 = &local_d0.field_0x14;
  local_d0._p[-1] = '\'';
  pcVar14 = pcVar14 + -1;
  local_d0._buffer[0x13] = '`';
  if (puVar4 != pcVar14) {
    local_78 = (detail *)0x0;
    pcVar13 = pcVar10;
    pdVar15 = pdVar2;
    do {
      pcVar16 = (char *)0x0;
      while( true ) {
        if (pcVar13 == pcVar16) {
          pcStack_70 = (char *)0x0;
          goto LAB_00108796;
        }
        if (pdVar15[(long)pcVar16] != *(detail *)(pcVar14 + (long)pcVar16)) break;
        pcVar3 = pcVar14 + (long)pcVar16;
        pcVar16 = pcVar16 + 1;
        if (pcVar3 + 1 == puVar4) {
          lVar11 = (long)pdVar15 - (long)pdVar2;
          local_78 = (detail *)0x0;
          pcStack_70 = (char *)0x0;
          if (lVar11 == -1 || pdVar15 == pdVar1 + uVar8) goto LAB_00108796;
          goto LAB_00108745;
        }
      }
      pdVar15 = pdVar15 + 1;
      pcVar13 = pcVar13 + -1;
    } while( true );
  }
  lVar11 = 0;
LAB_00108745:
  pcVar13 = puVar4 + ~(ulong)pcVar14 + lVar11;
  pcVar14 = pcVar13;
  if (pcVar10 < pcVar13) {
    pcVar14 = pcVar10;
  }
  uVar8 = (ulong)(pcVar13 < pcVar10);
  local_78 = pdVar2 + (long)pcVar14 + uVar8;
  pcVar10 = pcVar10 + (-uVar8 - (long)pcVar14);
  if (pcVar10 == (char *)0x0) {
    pcStack_70 = (char *)0x0;
  }
  else {
    pcVar13 = (char *)0x0;
    do {
      pcStack_70 = pcVar13;
      if ((this + uVar8 + (long)(pcVar14 + uVar12 + local_b0 + uVar6))[(long)pcVar13] ==
          (detail)0x27) break;
      pcVar13 = pcVar13 + 1;
      pcStack_70 = pcVar10;
    } while (pcVar10 != pcVar13);
  }
LAB_00108796:
  local_58 = (undefined1 *)((long)&local_d0 + (0x13U - (long)local_d0._p));
  pcStack_60 = local_d0._p;
  e._33_7_ = uStack_67;
  e.tag = (char)tag_00;
  e.name._len = uStack_80;
  e.name._ptr = (char *)local_88;
  e.enumerator._ptr = (char *)local_78;
  e.enumerator._len = (size_t)pcStack_70;
  e.value._ptr = local_d0._p;
  e.value._len = (size_t)local_58;
  local_68 = tag_00;
  binlog::ToStringVisitor::visit((ToStringVisitor *)tag._len,e);
  return;
}

Assistant:

void visit_tuple(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  tag.remove_prefix(1); // drop (
  tag.remove_suffix(1); // drop )

  const bool skip = visitor.visit(mserialize::Visitor::TupleBegin{tag}, istream);
  if (skip) { return; }

  for (string_view elem_tag = tag_pop(tag); ! elem_tag.empty(); elem_tag = tag_pop(tag))
  {
    visit_impl(full_tag, elem_tag, visitor, istream, max_recursion);
  }

  visitor.visit(mserialize::Visitor::TupleEnd{});
}